

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O1

void __thiscall
iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test::Body
          (iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestInfo *pTVar2;
  _Alloc_hider expr2;
  bool bVar3;
  char16_t **in_RDX;
  char *__s;
  TestResult *this_00;
  char16_t *p;
  string s;
  AssertionResult iutest_ar;
  LogChecker ck;
  iu_global_format_stringstream strm;
  type **in_stack_fffffffffffffd78;
  AssertionHelper local_280;
  char16_t *local_250;
  long *local_248 [2];
  long local_238 [2];
  string local_228;
  AssertionResult local_208;
  LogChecker local_1e0;
  undefined1 local_198 [128];
  ios_base local_118 [264];
  
  local_250 = L"𠮷";
  iutest::PrintToString<char16_t_const*>(&local_228,(iutest *)&local_250,in_RDX);
  if (*local_228._M_dataplus._M_p == '?') {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    if (((iutest::Test::Observer<void>::s_current == (Test *)0x0) ||
        (iutest::Test::Observer<void>::s_current->m_test_info == (iuITestInfoMediator *)0x0)) ||
       (pTVar2 = iutest::Test::Observer<void>::s_current->m_test_info->m_test_info,
       pTVar2 == (TestInfo *)0x0)) {
      if (*(long *)(iutest::UnitTestImpl::ptr()::ptr + 0x10) == 0) {
        this_00 = (TestResult *)(iutest::UnitTestImpl::ptr()::ptr + 0x38);
      }
      else {
        this_00 = (TestResult *)(*(long *)(iutest::UnitTestImpl::ptr()::ptr + 0x10) + 0x78);
      }
    }
    else {
      this_00 = &pTVar2->m_test_result;
    }
    bVar3 = iutest::TestResult::Failed(this_00);
    if (bVar3) {
      __s = "Skipped. but already failed. ";
    }
    else {
      __s = "Skipped. ";
      if ((iutest::Test::Observer<void>::s_current != (Test *)0x0) &&
         (pTVar2 = iutest::Test::Observer<void>::s_current->m_test_info->m_test_info,
         pTVar2 != (TestInfo *)0x0)) {
        pTVar2->m_skip = true;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,__s,(allocator<char> *)&local_280);
    local_1e0.printer_logger.super_iuLogger._vptr_iuLogger = (_func_int **)0x14b0c0;
    local_1e0.printer_logger.m_log._M_dataplus._M_p = (pointer)0xfffffffe00000170;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1e0,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.super_LogCheckerBase.m_str._M_dataplus._M_p !=
        &local_1e0.super_LogCheckerBase.m_str.field_2) {
      operator_delete(local_1e0.super_LogCheckerBase.m_str._M_dataplus._M_p,
                      local_1e0.super_LogCheckerBase.m_str.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base(local_118);
  }
  else {
    local_1e0.super_LogCheckerBase.m_str._M_dataplus._M_p =
         (pointer)&local_1e0.super_LogCheckerBase.m_str.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,anon_var_dwarf_3c299,anon_var_dwarf_3c299 + 4);
    expr2._M_p = local_1e0.super_LogCheckerBase.m_str._M_dataplus._M_p;
    iutest::detail::iuConsole::GetLoggerInstanceVariable()::sLogger = &local_1e0.printer_logger;
    local_1e0.printer_logger.super_iuLogger._vptr_iuLogger = (_func_int **)&PTR__TestLogger_0015e198
    ;
    local_1e0.printer_logger.m_log._M_dataplus._M_p =
         (pointer)&local_1e0.printer_logger.m_log.field_2;
    local_1e0.printer_logger.m_log._M_string_length = 0;
    local_1e0.printer_logger.m_log.field_2._M_local_buf[0] = '\0';
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::
    iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Print(&local_228,(iu_ostream *)(local_198 + 0x10));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base(local_118);
    iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
              (&local_208,(internal *)"static_cast<const char*>(ck)","::iutest::PrintToString(s)",
               expr2._M_p,(char *)local_248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd78);
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
    if (local_208.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,local_208.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffd7f);
      local_280.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
      ;
      local_280.m_part_result.super_iuCodeMessage.m_line = 0x177;
      local_280.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_280.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base(local_118);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
      operator_delete(local_208.m_message._M_dataplus._M_p,
                      local_208.m_message.field_2._M_allocated_capacity + 1);
    }
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_250;
    iutest::detail::iuStreamMessage::operator<<
              ((iuStreamMessage *)local_198,(char16_t **)&local_280);
    paVar1 = &local_280.m_part_result.super_iuCodeMessage.m_message.field_2;
    local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Succeeded.\n","");
    local_280.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
    ;
    local_280.m_part_result.super_iuCodeMessage.m_line = 0x178;
    local_280.m_part_result.super_iuCodeMessage._44_4_ = 0;
    iutest::AssertionHelper::OnFixed(&local_280,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_280.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_280.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base(local_118);
    LogChecker::~LogChecker(&local_1e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(PrintToTest, SurrogatePairChar16T)
{
    const char16_t* p = u"\U00020BB7";
    const ::std::string s = ::iutest::PrintToString(p);
    if( s[0] == '?' )
    {
        // FIXME
        IUTEST_SKIP();
    }
    else
    {
#if !defined(NO_TEST_SURROGATEPAIR)
        LogChecker ck("\U00020BB7");
        (void)ck;
        IUTEST_PRINTTOSTRING_EQ(ck, s);
        IUTEST_STREAMOUT_CHECK(p);
#endif
    }
}